

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iidentity_col_8xn_ssse3
               (uint8_t *output,int stride,__m128i *buf,int shift,int height,int txh_idx)

{
  undefined8 uVar1;
  undefined2 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i scale_coeff;
  __m128i one;
  __m128i shift_rounding;
  __m128i scale_rounding;
  __m128i scale;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_35c;
  byte local_2e4;
  undefined8 *local_2d0;
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 uStack_260;
  undefined2 uStack_25e;
  undefined2 uStack_25c;
  undefined2 uStack_25a;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  __m128i u;
  __m128i pred;
  __m128i x;
  __m128i hi;
  __m128i lo;
  short sStack_18;
  short sStack_16;
  int h;
  __m128i zero;
  
  uVar2 = (undefined2)NewSqrt2list[in_R9D];
  local_2e4 = (byte)in_ECX;
  iVar7 = 1 << (~local_2e4 & 0x1f);
  local_2d0 = in_RDI;
  for (local_35c = 0; local_35c < in_R8D; local_35c = local_35c + 1) {
    uVar1 = *(undefined8 *)(in_RDX + (long)local_35c * 0x10);
    local_2a8 = (undefined2)uVar1;
    uStack_2a6 = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_2a4 = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_2a2 = (undefined2)((ulong)uVar1 >> 0x30);
    local_378._0_4_ = CONCAT22(1,local_2a8);
    local_378._0_6_ = CONCAT24(uStack_2a6,(undefined4)local_378);
    local_378 = CONCAT26(1,(undefined6)local_378);
    uStack_370._0_2_ = uStack_2a4;
    uStack_370._2_2_ = 1;
    uStack_370._4_2_ = uStack_2a2;
    uStack_370._6_2_ = 1;
    uVar1 = *(undefined8 *)(in_RDX + (long)local_35c * 0x10 + 8);
    uStack_260 = (undefined2)uVar1;
    uStack_25e = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_25c = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_25a = (undefined2)((ulong)uVar1 >> 0x30);
    local_388._0_4_ = CONCAT22(1,uStack_260);
    local_388._0_6_ = CONCAT24(uStack_25e,(undefined4)local_388);
    local_388 = CONCAT26(1,(undefined6)local_388);
    uStack_380._0_2_ = uStack_25c;
    uStack_380._2_2_ = 1;
    uStack_380._4_2_ = uStack_25a;
    uStack_380._6_2_ = 1;
    auVar8._2_2_ = 0x800;
    auVar8._0_2_ = uVar2;
    auVar8._4_2_ = uVar2;
    auVar8._6_2_ = 0x800;
    auVar8._10_2_ = 0x800;
    auVar8._8_2_ = uVar2;
    auVar8._12_2_ = uVar2;
    auVar8._14_2_ = 0x800;
    auVar3._8_8_ = uStack_370;
    auVar3._0_8_ = local_378;
    auVar8 = pmaddwd(auVar3,auVar8);
    auVar9._2_2_ = 0x800;
    auVar9._0_2_ = uVar2;
    auVar9._4_2_ = uVar2;
    auVar9._6_2_ = 0x800;
    auVar9._10_2_ = 0x800;
    auVar9._8_2_ = uVar2;
    auVar9._12_2_ = uVar2;
    auVar9._14_2_ = 0x800;
    auVar10._8_8_ = uStack_380;
    auVar10._0_8_ = local_388;
    auVar9 = pmaddwd(auVar10,auVar9);
    local_168 = auVar8._0_4_;
    iStack_164 = auVar8._4_4_;
    iStack_160 = auVar8._8_4_;
    iStack_15c = auVar8._12_4_;
    auVar10 = ZEXT416(0xc);
    local_188 = auVar9._0_4_;
    iStack_184 = auVar9._4_4_;
    iStack_180 = auVar9._8_4_;
    iStack_17c = auVar9._12_4_;
    auVar9 = ZEXT416(0xc);
    auVar8 = ZEXT416((uint)-in_ECX);
    local_378 = CONCAT44((iStack_164 >> auVar10) + iVar7 >> auVar8,
                         (local_168 >> auVar10) + iVar7 >> auVar8);
    uStack_370._0_4_ = (iStack_160 >> auVar10) + iVar7 >> auVar8;
    uStack_370._4_4_ = (iStack_15c >> auVar10) + iVar7 >> auVar8;
    auVar10 = ZEXT416((uint)-in_ECX);
    local_388 = CONCAT44((iStack_184 >> auVar9) + iVar7 >> auVar10,
                         (local_188 >> auVar9) + iVar7 >> auVar10);
    uStack_380._0_4_ = (iStack_180 >> auVar9) + iVar7 >> auVar10;
    uStack_380._4_4_ = (iStack_17c >> auVar9) + iVar7 >> auVar10;
    auVar5._8_8_ = uStack_370;
    auVar5._0_8_ = local_378;
    auVar4._8_8_ = uStack_380;
    auVar4._0_8_ = local_388;
    auVar9 = packssdw(auVar5,auVar4);
    uVar1 = *local_2d0;
    hi[1]._0_1_ = (byte)uVar1;
    hi[1]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
    hi[1]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
    hi[1]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
    hi[1]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
    hi[1]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
    hi[1]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
    hi[1]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
    auVar6[1] = 0;
    auVar6[0] = (byte)hi[1];
    auVar6[2] = hi[1]._1_1_;
    auVar6[3] = 0;
    auVar6[4] = hi[1]._2_1_;
    auVar6[5] = 0;
    auVar6[6] = hi[1]._3_1_;
    auVar6[7] = 0;
    auVar6[8] = hi[1]._4_1_;
    auVar6[9] = 0;
    auVar6[10] = hi[1]._5_1_;
    auVar6[0xb] = 0;
    auVar6[0xc] = hi[1]._6_1_;
    auVar6[0xd] = 0;
    auVar6[0xe] = hi[1]._7_1_;
    auVar6[0xf] = 0;
    auVar9 = paddsw(auVar9,auVar6);
    sStack_18 = auVar9._0_2_;
    sStack_16 = auVar9._2_2_;
    h._0_2_ = auVar9._4_2_;
    h._2_2_ = auVar9._6_2_;
    zero[0]._0_2_ = auVar9._8_2_;
    zero[0]._2_2_ = auVar9._10_2_;
    zero[0]._4_2_ = auVar9._12_2_;
    zero[0]._6_2_ = auVar9._14_2_;
    *local_2d0 = CONCAT17((0 < zero[0]._6_2_) * (zero[0]._6_2_ < 0x100) * auVar9[0xe] -
                          (0xff < zero[0]._6_2_),
                          CONCAT16((0 < zero[0]._4_2_) * (zero[0]._4_2_ < 0x100) * auVar9[0xc] -
                                   (0xff < zero[0]._4_2_),
                                   CONCAT15((0 < zero[0]._2_2_) * (zero[0]._2_2_ < 0x100) *
                                            auVar9[10] - (0xff < zero[0]._2_2_),
                                            CONCAT14((0 < (short)zero[0]) * ((short)zero[0] < 0x100)
                                                     * auVar9[8] - (0xff < (short)zero[0]),
                                                     CONCAT13((0 < h._2_2_) * (h._2_2_ < 0x100) *
                                                              auVar9[6] - (0xff < h._2_2_),
                                                              CONCAT12((0 < (short)h) *
                                                                       ((short)h < 0x100) *
                                                                       auVar9[4] - (0xff < (short)h)
                                                                       ,CONCAT11((0 < sStack_16) *
                                                                                 (sStack_16 < 0x100)
                                                                                 * auVar9[2] -
                                                                                 (0xff < sStack_16),
                                                                                 (0 < sStack_18) *
                                                                                 (sStack_18 < 0x100)
                                                                                 * auVar9[0] -
                                                                                 (0xff < sStack_18))
                                                                      ))))));
    local_2d0 = (undefined8 *)((long)local_2d0 + (long)in_ESI);
  }
  return;
}

Assistant:

static inline void iidentity_col_8xn_ssse3(uint8_t *output, int stride,
                                           __m128i *buf, int shift, int height,
                                           int txh_idx) {
  const __m128i scale = _mm_set1_epi16(NewSqrt2list[txh_idx]);
  const __m128i scale_rounding = _mm_set1_epi16(1 << (NewSqrt2Bits - 1));
  const __m128i shift_rounding = _mm_set1_epi32(1 << (-shift - 1));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i scale_coeff = _mm_unpacklo_epi16(scale, scale_rounding);
  const __m128i zero = _mm_setzero_si128();
  for (int h = 0; h < height; ++h) {
    __m128i lo = _mm_unpacklo_epi16(buf[h], one);
    __m128i hi = _mm_unpackhi_epi16(buf[h], one);
    lo = _mm_madd_epi16(lo, scale_coeff);
    hi = _mm_madd_epi16(hi, scale_coeff);
    lo = _mm_srai_epi32(lo, NewSqrt2Bits);
    hi = _mm_srai_epi32(hi, NewSqrt2Bits);
    lo = _mm_add_epi32(lo, shift_rounding);
    hi = _mm_add_epi32(hi, shift_rounding);
    lo = _mm_srai_epi32(lo, -shift);
    hi = _mm_srai_epi32(hi, -shift);
    __m128i x = _mm_packs_epi32(lo, hi);

    const __m128i pred = _mm_loadl_epi64((__m128i const *)(output));
    x = _mm_adds_epi16(x, _mm_unpacklo_epi8(pred, zero));
    const __m128i u = _mm_packus_epi16(x, x);
    _mm_storel_epi64((__m128i *)(output), u);
    output += stride;
  }
}